

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsFederate generateNewHelicsFederateObject(shared_ptr<helics::Federate> *fed,FederateType type)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_helics::FedObject_*,_false> __s;
  __single_object fedI;
  __uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> local_40;
  _Head_base<0UL,_helics::FedObject_*,_false> local_38;
  MasterObjectHolder *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  __s._M_head_impl = (FedObject *)operator_new(0x108);
  memset(__s._M_head_impl,0,0x108);
  (__s._M_head_impl)->index = -2;
  memset(&(__s._M_head_impl)->messages,0,0xa8);
  ((__s._M_head_impl)->commandBuffer).first._M_dataplus._M_p =
       (pointer)&((__s._M_head_impl)->commandBuffer).first.field_2;
  ((__s._M_head_impl)->commandBuffer).second._M_dataplus._M_p =
       (pointer)&((__s._M_head_impl)->commandBuffer).second.field_2;
  peVar1 = (fed->super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (fed->super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (fed->super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (fed->super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((__s._M_head_impl)->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  ((__s._M_head_impl)->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (__s._M_head_impl)->type = type;
  (__s._M_head_impl)->valid = 0x2352188;
  local_40._M_t.super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>
  .super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl =
       (tuple<helics::FedObject_*,_std::default_delete<helics::FedObject>_>)
       (tuple<helics::FedObject_*,_std::default_delete<helics::FedObject>_>)__s._M_head_impl;
  getMasterHolder();
  local_40._M_t.super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>
  .super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl =
       (tuple<helics::FedObject_*,_std::default_delete<helics::FedObject>_>)
       (_Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>)0x0;
  local_38._M_head_impl = __s._M_head_impl;
  MasterObjectHolder::addFed
            (local_30,(unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                      &local_38);
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::~unique_ptr
            ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)&local_38);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::~unique_ptr
            ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)&local_40);
  return (_Head_base<0UL,_helics::FedObject_*,_false>)__s._M_head_impl;
}

Assistant:

HelicsFederate generateNewHelicsFederateObject(std::shared_ptr<helics::Federate> fed, helics::FederateType type)
{
    auto fedI = std::make_unique<helics::FedObject>();
    fedI->fedptr = std::move(fed);
    fedI->type = type;
    fedI->valid = fedValidationIdentifier;
    auto* hfed = reinterpret_cast<HelicsFederate>(fedI.get());
    getMasterHolder()->addFed(std::move(fedI));
    return (hfed);
}